

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StreamExpressionWithRangeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionWithRangeSyntax,slang::parsing::Token,slang::syntax::ElementSelectSyntax&>
          (BumpAllocator *this,Token *args,ElementSelectSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  StreamExpressionWithRangeSyntax *pSVar6;
  
  pSVar6 = (StreamExpressionWithRangeSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StreamExpressionWithRangeSyntax *)this->endPtr < pSVar6 + 1) {
    pSVar6 = (StreamExpressionWithRangeSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pSVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pSVar6->super_SyntaxNode).kind = StreamExpressionWithRange;
  (pSVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pSVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pSVar6->withKeyword).kind = TVar2;
  (pSVar6->withKeyword).field_0x2 = uVar3;
  (pSVar6->withKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pSVar6->withKeyword).rawLen = uVar5;
  (pSVar6->withKeyword).info = pIVar1;
  (pSVar6->range).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pSVar6->super_SyntaxNode;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }